

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy-stubs-internal.h
# Opt level: O0

char * duckdb_snappy::Varint::Parse32WithLimit(char *p,char *l,uint32_t *OUTPUT)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  uint32_t result;
  uint32_t b;
  uchar *limit;
  uchar *ptr;
  uint32_t *OUTPUT_local;
  char *l_local;
  char *p_local;
  
  if (l <= p) {
    return (char *)0x0;
  }
  ptr = (uchar *)(p + 1);
  result = (byte)*p & 0x7f;
  if (0x7f < (byte)*p) {
    if (l <= ptr) {
      return (char *)0x0;
    }
    pbVar2 = (byte *)(p + 2);
    bVar1 = *ptr;
    result = (bVar1 & 0x7f) << 7 | result;
    ptr = pbVar2;
    if (0x7f < bVar1) {
      if (l <= pbVar2) {
        return (char *)0x0;
      }
      pbVar3 = (byte *)(p + 3);
      result = (*pbVar2 & 0x7f) << 0xe | result;
      ptr = pbVar3;
      if (0x7f < *pbVar2) {
        if (l <= pbVar3) {
          return (char *)0x0;
        }
        pbVar2 = (byte *)(p + 4);
        result = (*pbVar3 & 0x7f) << 0x15 | result;
        ptr = pbVar2;
        if (0x7f < *pbVar3) {
          if (l <= pbVar2) {
            return (char *)0x0;
          }
          result = (uint)*pbVar2 << 0x1c | result;
          ptr = (uchar *)(p + 5);
          if (0xf < *pbVar2) {
            return (char *)0x0;
          }
        }
      }
    }
  }
  *OUTPUT = result;
  return (char *)ptr;
}

Assistant:

inline const char* Varint::Parse32WithLimit(const char* p,
                                            const char* l,
                                            uint32_t* OUTPUT) {
  const unsigned char* ptr = reinterpret_cast<const unsigned char*>(p);
  const unsigned char* limit = reinterpret_cast<const unsigned char*>(l);
  uint32_t b, result;
  if (ptr >= limit) return NULL;
  b = *(ptr++); result = b & 127;          if (b < 128) goto done;
  if (ptr >= limit) return NULL;
  b = *(ptr++); result |= (b & 127) <<  7; if (b < 128) goto done;
  if (ptr >= limit) return NULL;
  b = *(ptr++); result |= (b & 127) << 14; if (b < 128) goto done;
  if (ptr >= limit) return NULL;
  b = *(ptr++); result |= (b & 127) << 21; if (b < 128) goto done;
  if (ptr >= limit) return NULL;
  b = *(ptr++); result |= (b & 127) << 28; if (b < 16) goto done;
  return NULL;       // Value is too long to be a varint32
 done:
  *OUTPUT = result;
  return reinterpret_cast<const char*>(ptr);
}